

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createMatrixConstructor
          (Builder *this,Decoration precision,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sources,Id resultTypeId)

{
  bool bVar1;
  uint uVar2;
  Id typeId;
  uint uVar3;
  Id IVar4;
  Instruction *this_00;
  const_reference pvVar5;
  size_type sVar6;
  const_iterator __last1;
  const_iterator __first2;
  uint *puVar7;
  Id local_1d8;
  Id local_1d4;
  bool local_1cd;
  Id local_1c0;
  uint local_1bc;
  Id column;
  uint row_4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vectorComponents;
  undefined1 local_198 [4];
  uint col_5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> matrixColumns;
  uint local_178;
  Id columnTypeId;
  uint comp;
  Id argComp;
  uint arg;
  uint col_4;
  uint row_3;
  uint row_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes_1;
  uint local_140;
  uint col_3;
  uint local_138;
  uint minRows;
  Id local_130;
  uint minCols;
  Id matrix_1;
  int col_2;
  int row_1;
  int col_1;
  Id zero;
  Id one;
  Id ids [4] [4];
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b8;
  Id local_b0;
  Id local_ac;
  undefined1 local_a8 [4];
  Id colv;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  undefined1 local_88 [4];
  uint col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> matrixColumns_1;
  undefined1 local_68 [4];
  uint row;
  vector<unsigned_int,_std::allocator<unsigned_int>_> channels;
  Id sourceColumnTypeId;
  Id columnTypeId_1;
  Id matrix;
  uint bitCount;
  Instruction *instr;
  uint numRows;
  uint numCols;
  Id componentTypeId;
  Id resultTypeId_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sources_local;
  Builder *pBStack_18;
  Decoration precision_local;
  Builder *this_local;
  
  numCols = resultTypeId;
  _componentTypeId = sources;
  sources_local._4_4_ = precision;
  pBStack_18 = this;
  numRows = getScalarTypeId(this,resultTypeId);
  instr._4_4_ = getTypeNumColumns(this,numCols);
  instr._0_4_ = getTypeNumRows(this,numCols);
  this_00 = Module::getInstruction(&this->module,numRows);
  uVar2 = spv::Instruction::getImmediateOperand(this_00,0);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_componentTypeId,0);
  bVar1 = isMatrix(this,*pvVar5);
  if (bVar1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (_componentTypeId,0);
    uVar3 = getNumColumns(this,*pvVar5);
    if (instr._4_4_ <= uVar3) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (_componentTypeId,0);
      uVar3 = getNumRows(this,*pvVar5);
      if ((uint)instr <= uVar3) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (_componentTypeId,0);
        IVar4 = *pvVar5;
        channels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = getContainedTypeId(this,numCols);
        typeId = getTypeId(this,IVar4);
        channels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = getContainedTypeId(this,typeId);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
        for (matrixColumns_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            matrixColumns_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ < (uint)instr;
            matrixColumns_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 matrixColumns_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68,
                     (value_type *)
                     ((long)&matrixColumns_1.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage + 4));
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
        for (indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ < instr._4_4_;
            indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,
                     (value_type *)
                     ((long)&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          local_ac = createCompositeExtract
                               (this,IVar4,
                                (Id)channels.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
          setPrecision(this,local_ac,sources_local._4_4_);
          uVar2 = (uint)instr;
          uVar3 = getNumRows(this,IVar4);
          if (uVar2 == uVar3) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,&local_ac);
          }
          else {
            local_b0 = createRvalueSwizzle(this,sources_local._4_4_,
                                           channels.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                           local_ac,(
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_68);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,&local_b0);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
        }
        IVar4 = createCompositeConstruct
                          (this,numCols,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
        this_local._4_4_ = setPrecision(this,IVar4,sources_local._4_4_);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_68);
        return this_local._4_4_;
      }
    }
  }
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_componentTypeId);
  local_1cd = false;
  if (sVar6 == instr._4_4_) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (_componentTypeId,0);
    bVar1 = isVector(this,*pvVar5);
    local_1cd = false;
    if (bVar1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (_componentTypeId,0);
      uVar3 = getNumComponents(this,*pvVar5);
      local_1cd = false;
      if (uVar3 == (uint)instr) {
        local_c0._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               (_componentTypeId);
        local_b8 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator+(&local_c0,1);
        __last1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(_componentTypeId);
        __first2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(_componentTypeId)
        ;
        local_1cd = std::
                    equal<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                              (local_b8,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         )__last1._M_current,
                               (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                )__first2._M_current);
      }
    }
  }
  if (local_1cd != false) {
    IVar4 = createCompositeConstruct(this,numCols,_componentTypeId);
    IVar4 = setPrecision(this,IVar4,sources_local._4_4_);
    return IVar4;
  }
  if (uVar2 == 0x40) {
    local_1d4 = makeDoubleConstant(this,1.0,false);
  }
  else {
    local_1d4 = makeFloatConstant(this,1.0,false);
  }
  col_1 = local_1d4;
  if (uVar2 == 0x40) {
    local_1d8 = makeDoubleConstant(this,0.0,false);
  }
  else {
    local_1d8 = makeFloatConstant(this,0.0,false);
  }
  row_1 = local_1d8;
  for (col_2 = 0; col_2 < 4; col_2 = col_2 + 1) {
    for (matrix_1 = 0; (int)matrix_1 < 4; matrix_1 = matrix_1 + 1) {
      if (col_2 == matrix_1) {
        (&zero)[(long)col_2 * 4 + (long)(int)matrix_1] = col_1;
      }
      else {
        (&zero)[(long)col_2 * 4 + (long)(int)matrix_1] = local_1d8;
      }
    }
  }
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_componentTypeId);
  if (sVar6 == 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (_componentTypeId,0);
    bVar1 = isScalar(this,*pvVar5);
    if (bVar1) {
      for (minCols = 0; (int)minCols < 4; minCols = minCols + 1) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (_componentTypeId,0);
        (&zero)[(long)(int)minCols * 4 + (long)(int)minCols] = *pvVar5;
      }
      goto LAB_0060fdfa;
    }
  }
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_componentTypeId,0);
  bVar1 = isMatrix(this,*pvVar5);
  if (bVar1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (_componentTypeId,0);
    local_130 = *pvVar5;
    local_138 = getNumColumns(this,local_130);
    puVar7 = std::min<unsigned_int>((uint *)((long)&instr + 4),&local_138);
    minRows = *puVar7;
    local_140 = getNumRows(this,local_130);
    puVar7 = std::min<unsigned_int>((uint *)&instr,&local_140);
    col_3 = *puVar7;
    for (indexes_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        indexes_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < minRows;
        indexes_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             indexes_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&row_3);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&row_3,
                 (value_type *)
                 ((long)&indexes_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      for (col_4 = 0; col_4 < col_3; col_4 = col_4 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&row_3,&col_4);
        IVar4 = createCompositeExtract
                          (this,local_130,numRows,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&row_3);
        (&zero)[(ulong)indexes_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 4 + (ulong)col_4] =
             IVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&row_3);
        setPrecision(this,(&zero)[(ulong)indexes_1.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ *
                                  4 + (ulong)col_4],sources_local._4_4_);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&row_3);
    }
  }
  else {
    arg = 0;
    argComp = 0;
    for (comp = 0;
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_componentTypeId),
        comp < sVar6 && argComp < instr._4_4_; comp = comp + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (_componentTypeId,(ulong)comp);
      columnTypeId = *pvVar5;
      local_178 = 0;
      while( true ) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (_componentTypeId,(ulong)comp);
        uVar2 = getNumComponents(this,*pvVar5);
        if (uVar2 <= local_178) break;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (_componentTypeId,(ulong)comp);
        uVar2 = getNumComponents(this,*pvVar5);
        if (1 < uVar2) {
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (_componentTypeId,(ulong)comp);
          columnTypeId = createCompositeExtract(this,*pvVar5,numRows,local_178);
          setPrecision(this,columnTypeId,sources_local._4_4_);
        }
        uVar2 = arg + 1;
        (&zero)[(ulong)argComp * 4 + (ulong)arg] = columnTypeId;
        arg = uVar2;
        if (uVar2 == (uint)instr) {
          arg = 0;
          argComp = argComp + 1;
        }
        if (argComp == instr._4_4_) break;
        local_178 = local_178 + 1;
      }
    }
  }
LAB_0060fdfa:
  matrixColumns.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = getContainedTypeId(this,numCols);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198);
  for (vectorComponents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      vectorComponents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < instr._4_4_;
      vectorComponents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           vectorComponents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&column);
    for (local_1bc = 0; local_1bc < (uint)instr; local_1bc = local_1bc + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&column,
                 &zero + (ulong)vectorComponents.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 4 +
                         (ulong)local_1bc);
    }
    local_1c0 = createCompositeConstruct
                          (this,matrixColumns.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&column);
    setPrecision(this,local_1c0,sources_local._4_4_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198,&local_1c0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&column);
  }
  IVar4 = createCompositeConstruct
                    (this,numCols,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198);
  this_local._4_4_ = setPrecision(this,IVar4,sources_local._4_4_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198);
  return this_local._4_4_;
}

Assistant:

Id Builder::createMatrixConstructor(Decoration precision, const std::vector<Id>& sources, Id resultTypeId)
{
    Id componentTypeId = getScalarTypeId(resultTypeId);
    unsigned int numCols = getTypeNumColumns(resultTypeId);
    unsigned int numRows = getTypeNumRows(resultTypeId);

    Instruction* instr = module.getInstruction(componentTypeId);
    const unsigned bitCount = instr->getImmediateOperand(0);

    // Optimize matrix constructed from a bigger matrix
    if (isMatrix(sources[0]) && getNumColumns(sources[0]) >= numCols && getNumRows(sources[0]) >= numRows) {
        // To truncate the matrix to a smaller number of rows/columns, we need to:
        // 1. For each column, extract the column and truncate it to the required size using shuffle
        // 2. Assemble the resulting matrix from all columns
        Id matrix = sources[0];
        Id columnTypeId = getContainedTypeId(resultTypeId);
        Id sourceColumnTypeId = getContainedTypeId(getTypeId(matrix));

        std::vector<unsigned> channels;
        for (unsigned int row = 0; row < numRows; ++row)
            channels.push_back(row);

        std::vector<Id> matrixColumns;
        for (unsigned int col = 0; col < numCols; ++col) {
            std::vector<unsigned> indexes;
            indexes.push_back(col);
            Id colv = createCompositeExtract(matrix, sourceColumnTypeId, indexes);
            setPrecision(colv, precision);

            if (numRows != getNumRows(matrix)) {
                matrixColumns.push_back(createRvalueSwizzle(precision, columnTypeId, colv, channels));
            } else {
                matrixColumns.push_back(colv);
            }
        }

        return setPrecision(createCompositeConstruct(resultTypeId, matrixColumns), precision);
    }

    // Detect a matrix being constructed from a repeated vector of the correct size.
    // Create the composite directly from it.
    if (sources.size() == numCols && isVector(sources[0]) && getNumComponents(sources[0]) == numRows &&
        std::equal(sources.begin() + 1, sources.end(), sources.begin())) {
        return setPrecision(createCompositeConstruct(resultTypeId, sources), precision);
    }

    // Otherwise, will use a two step process
    // 1. make a compile-time 2D array of values
    // 2. construct a matrix from that array

    // Step 1.

    // initialize the array to the identity matrix
    Id ids[maxMatrixSize][maxMatrixSize];
    Id  one = (bitCount == 64 ? makeDoubleConstant(1.0) : makeFloatConstant(1.0));
    Id zero = (bitCount == 64 ? makeDoubleConstant(0.0) : makeFloatConstant(0.0));
    for (int col = 0; col < 4; ++col) {
        for (int row = 0; row < 4; ++row) {
            if (col == row)
                ids[col][row] = one;
            else
                ids[col][row] = zero;
        }
    }

    // modify components as dictated by the arguments
    if (sources.size() == 1 && isScalar(sources[0])) {
        // a single scalar; resets the diagonals
        for (int col = 0; col < 4; ++col)
            ids[col][col] = sources[0];
    } else if (isMatrix(sources[0])) {
        // constructing from another matrix; copy over the parts that exist in both the argument and constructee
        Id matrix = sources[0];
        unsigned int minCols = std::min(numCols, getNumColumns(matrix));
        unsigned int minRows = std::min(numRows, getNumRows(matrix));
        for (unsigned int col = 0; col < minCols; ++col) {
            std::vector<unsigned> indexes;
            indexes.push_back(col);
            for (unsigned int row = 0; row < minRows; ++row) {
                indexes.push_back(row);
                ids[col][row] = createCompositeExtract(matrix, componentTypeId, indexes);
                indexes.pop_back();
                setPrecision(ids[col][row], precision);
            }
        }
    } else {
        // fill in the matrix in column-major order with whatever argument components are available
        unsigned int row = 0;
        unsigned int col = 0;

        for (unsigned int arg = 0; arg < sources.size() && col < numCols; ++arg) {
            Id argComp = sources[arg];
            for (unsigned int comp = 0; comp < getNumComponents(sources[arg]); ++comp) {
                if (getNumComponents(sources[arg]) > 1) {
                    argComp = createCompositeExtract(sources[arg], componentTypeId, comp);
                    setPrecision(argComp, precision);
                }
                ids[col][row++] = argComp;
                if (row == numRows) {
                    row = 0;
                    col++;
                }
                if (col == numCols) {
                    // If more components are provided than fit the matrix, discard the rest.
                    break;
                }
            }
        }
    }

    // Step 2:  Construct a matrix from that array.
    // First make the column vectors, then make the matrix.

    // make the column vectors
    Id columnTypeId = getContainedTypeId(resultTypeId);
    std::vector<Id> matrixColumns;
    for (unsigned int col = 0; col < numCols; ++col) {
        std::vector<Id> vectorComponents;
        for (unsigned int row = 0; row < numRows; ++row)
            vectorComponents.push_back(ids[col][row]);
        Id column = createCompositeConstruct(columnTypeId, vectorComponents);
        setPrecision(column, precision);
        matrixColumns.push_back(column);
    }

    // make the matrix
    return setPrecision(createCompositeConstruct(resultTypeId, matrixColumns), precision);
}